

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

void init_adf_data(cbify *data,size_t num_actions)

{
  vector<example_*,_std::allocator<example_*>_> *this;
  reference ppeVar1;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  long in_RDI;
  label *lab;
  size_t a;
  cbify_adf_data *adf_data;
  example *in_stack_ffffffffffffffd0;
  polylabel *in_stack_ffffffffffffffd8;
  vector<example_*,_std::allocator<example_*>_> *local_20;
  
  this = (vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x60);
  *(vector<example_*,_std::allocator<example_*>_> **)(in_RDI + 0x78) = in_RSI;
  std::vector<example_*,_std::allocator<example_*>_>::resize(in_RSI,(size_type)this);
  for (local_20 = (vector<example_*,_std::allocator<example_*>_> *)0x0; local_20 < in_RSI;
      local_20 = (vector<example_*,_std::allocator<example_*>_> *)
                 ((long)&(local_20->super__Vector_base<example_*,_std::allocator<example_*>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1)) {
    in_stack_ffffffffffffffd0 =
         VW::alloc_examples((size_t)in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0);
    ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (this,(size_type)local_20);
    *ppeVar1 = in_stack_ffffffffffffffd0;
    ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (this,(size_type)local_20);
    in_stack_ffffffffffffffd8 = &(*ppeVar1)->l;
    (*(code *)CB::cb_label)(in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void init_adf_data(cbify& data, const size_t num_actions)
{
  auto& adf_data = data.adf_data;
  adf_data.num_actions = num_actions;

  adf_data.ecs.resize(num_actions);
  for (size_t a = 0; a < num_actions; ++a)
  {
    adf_data.ecs[a] = VW::alloc_examples(CB::cb_label.label_size, 1);
    auto& lab = adf_data.ecs[a]->l.cb;
    CB::cb_label.default_label(&lab);
  }
}